

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

uint16_t calc_crc(uint8_t *payload,uint16_t length)

{
  ulong uVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  ushort uVar3;
  
  if ((int)CONCAT62(in_register_00000032,length) != 0) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar3 = (ushort)(uVar1 >> 4) ^
              *(ushort *)
               (__calc_crc_crc_table + (ulong)(((uint)uVar1 ^ (uint)payload[uVar2]) & 0xf) * 2);
      uVar3 = uVar3 >> 4 ^
              *(ushort *)
               (__calc_crc_crc_table + (ulong)(uVar3 & 0xf ^ (uint)(payload[uVar2] >> 4)) * 2);
      uVar1 = (ulong)uVar3;
      uVar2 = uVar2 + 1;
    } while (length != uVar2);
    return uVar3;
  }
  return 0;
}

Assistant:

static uint16_t calc_crc(const uint8_t *payload, uint16_t length)
{
    uint16_t crc = 0;
    for(int i = 0;i < length;i++) {
        crc = __calc_crc(payload[i], crc);
    }
    return crc;
}